

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

int __thiscall
vkt::pipeline::TestTextureCubeArray::copy
          (TestTextureCubeArray *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int size;
  int arraySize;
  TestTextureCubeArray *this_00;
  TestTexture *destTexture;
  DefaultDeleter<vkt::pipeline::TestTexture> local_35 [20];
  undefined1 local_21;
  EVP_PKEY_CTX *local_20;
  TestTextureCubeArray *this_local;
  TextureFormat format_local;
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *texture;
  
  local_21 = 0;
  local_20 = dst;
  this_local = (TestTextureCubeArray *)src;
  format_local = (TextureFormat)this;
  this_00 = (TestTextureCubeArray *)operator_new(0x70);
  size = tcu::TextureCubeArray::getSize((TextureCubeArray *)(dst + 0x20));
  arraySize = (**(code **)(*(long *)dst + 0x20))();
  TestTextureCubeArray(this_00,(TextureFormat *)&this_local,size,arraySize);
  de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(local_35);
  de::details::MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  ::MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *)
            this,this_00);
  destTexture = de::details::
                UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                ::operator*((UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                             *)this);
  TestTexture::copyToTexture((TestTexture *)dst,destTexture);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTextureCubeArray::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTextureCubeArray(format, m_texture.getSize(), getArraySize()));

	copyToTexture(*texture);

	return texture;
}